

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  ctrl_t *pcVar1;
  ushort uVar2;
  char *pcVar3;
  ushort *puVar4;
  Context *pCVar5;
  pointer pcVar6;
  OneofDescriptor *oneof;
  Nullable<const_char_*> pcVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  JavaType type;
  ImmutableFieldLiteGenerator *pIVar11;
  reference ppVar12;
  Descriptor *pDVar13;
  Nonnull<const_char_*> pcVar14;
  ulong uVar15;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar16;
  FieldDescriptor *pFVar17;
  FieldDescriptor *extraout_RDX_04;
  int iVar18;
  long lVar19;
  Nonnull<char_*> pcVar20;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *pbVar21;
  uint uVar22;
  size_t sVar23;
  string *psVar24;
  long *plVar25;
  char *pcVar26;
  char *pcVar27;
  long lVar28;
  anon_union_8_1_a8a14541_for_iterator_2 aVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  string_view begin_varname;
  string_view text;
  const_iterator other;
  string_view begin_varname_00;
  string_view text_00;
  string_view begin_varname_01;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view text_06;
  string_view begin_varname_04;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  iterator iVar32;
  string_view text_24;
  string_view format;
  string_view text_25;
  string_view text_26;
  string_view text_27;
  string_view text_28;
  string_view text_29;
  string_view text_30;
  string_view text_31;
  string_view text_32;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  ImmutableMessageLiteGenerator messageGenerator;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string builder_type;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  undefined1 local_1a8 [48];
  undefined1 local_178 [32];
  long local_158 [2];
  undefined1 local_148 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *local_100;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *local_f8;
  string local_f0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_d0;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
  local_b0;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  pDVar13 = (this->super_MessageGenerator).descriptor_;
  if (pDVar13->containing_type_ == (Descriptor *)0x0) {
    bVar8 = NestedInFileClass(pDVar13,true);
    pcVar27 = " ";
    if (bVar8) {
      pcVar27 = " static ";
    }
  }
  else {
    pcVar27 = " static ";
  }
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1a8,(char (*) [2])0x11df38e,(char (*) [1])(anon_var_dwarf_a22956 + 5));
  pcVar26 = anon_var_dwarf_a22956 + 5;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_178,(char (*) [2])0x11e92ba,(char (*) [1])(anon_var_dwarf_a22956 + 5));
  psVar24 = &local_f0;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)&local_a0,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1a8,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_148,0,(hasher *)&local_d0,(key_equal *)psVar24,(allocator_type *)local_148);
  lVar19 = -0x60;
  plVar25 = local_158;
  do {
    if (plVar25 != (long *)plVar25[-2]) {
      operator_delete((long *)plVar25[-2],*plVar25 + 1);
    }
    plVar25 = plVar25 + -6;
    lVar19 = lVar19 + 0x30;
  } while (lVar19 != 0);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[7]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_1a8,&local_a0,(char (*) [7])"static");
  pcVar3 = *(char **)(local_1a8._8_8_ + 0x18);
  pcVar20 = (Nonnull<char_*>)(local_1a8._8_8_ + 0x10);
  strlen(pcVar27);
  std::__cxx11::string::_M_replace((ulong)pcVar20,0,pcVar3,(ulong)pcVar27);
  puVar4 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,(long)puVar4 + ~(ulong)*puVar4,(long)puVar4 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>(&local_d0,&local_a0,(char (*) [10])0x13005f3);
  std::__cxx11::string::operator=
            ((string *)((long)local_d0.first.field_1.slot_ + 0x10),(string *)local_1a8);
  pDVar13 = extraout_RDX;
  if ((ctrl_t *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    pDVar13 = extraout_RDX_00;
  }
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)local_1a8,(java *)(this->super_MessageGenerator).descriptor_,pDVar13);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>(&local_d0,&local_a0,(char (*) [17])"extra_interfaces");
  std::__cxx11::string::operator=
            ((string *)((long)local_d0.first.field_1.slot_ + 0x10),(string *)local_1a8);
  if ((ctrl_t *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  bVar8 = (((this->super_MessageGenerator).descriptor_)->options_->field_0)._impl_.deprecated_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[12]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_1a8,&local_a0,(char (*) [12])"deprecation");
  if (bVar8 != false) {
    pcVar26 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)(local_1a8._8_8_ + 0x10),0,*(char **)(local_1a8._8_8_ + 0x18),(ulong)pcVar26);
  pDVar13 = (this->super_MessageGenerator).descriptor_;
  pCVar5 = this->context_;
  local_80[4] = (pCVar5->options_).opensource_runtime;
  local_80[5] = (pCVar5->options_).annotate_code;
  local_80[0] = (pCVar5->options_).generate_immutable_code;
  local_80[1] = (pCVar5->options_).generate_mutable_code;
  local_80[2] = (pCVar5->options_).generate_shared_code;
  local_80[3] = (pCVar5->options_).enforce_lite;
  pcVar6 = (pCVar5->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar6,
             pcVar6 + (pCVar5->options_).annotation_list_file._M_string_length);
  pcVar6 = (pCVar5->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar6,
             pcVar6 + (pCVar5->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar5->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar5->options_).jvm_dsl;
  WriteMessageDocComment(printer,pDVar13,(Options *)local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  pDVar13 = (this->super_MessageGenerator).descriptor_;
  pCVar5 = this->context_;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,anon_var_dwarf_a22956 + 5);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (pCVar5,printer,pDVar13,true,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  local_d0.first.ctrl_ = &local_d0.second;
  local_d0.first.field_1.slot_ = (slot_type *)0x0;
  local_d0.second = false;
  if (((this->super_MessageGenerator).descriptor_)->extension_range_count_ < 1) {
    text_25._M_str =
         "$deprecation$public $static$final class ${$$classname$$}$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_25._M_len = 0xd7;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_a0,text_25);
    std::__cxx11::string::_M_replace
              ((ulong)&local_d0,0,(char *)local_d0.first.field_1.slot_,0x1337102);
  }
  else {
    text_24._M_str =
         "$deprecation$public $static$final class ${$$classname$$}$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_24._M_len = 0xe7;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_a0,text_24);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_f0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
    local_1a8._8_8_ = (slot_type *)0x0;
    local_1a8[0x10] = false;
    local_148._0_8_ = local_f0._M_string_length;
    local_148._8_8_ = local_f0._M_dataplus._M_p;
    format._M_str = local_148;
    format._M_len = (size_t)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>";
    local_1a8._0_8_ = local_1a8 + 0x10;
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)local_1a8,(Nonnull<std::string_*>)0x41,format,
               (Nullable<const_absl::string_view_*>)0x1,(size_t)psVar24);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,begin_varname,end_varname,(this->super_MessageGenerator).descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  GenerateConstructor(this,printer);
  pDVar13 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar13->enum_type_count_) {
    lVar19 = 0;
    lVar28 = 0;
    do {
      EnumLiteGenerator::EnumLiteGenerator
                ((EnumLiteGenerator *)local_1a8,
                 (EnumDescriptor *)(&pDVar13->enum_types_->super_SymbolBase + lVar19),true,
                 this->context_);
      EnumLiteGenerator::Generate((EnumLiteGenerator *)local_1a8,printer);
      EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)local_1a8);
      lVar28 = lVar28 + 1;
      pDVar13 = (this->super_MessageGenerator).descriptor_;
      lVar19 = lVar19 + 0x58;
    } while (lVar28 < pDVar13->enum_type_count_);
  }
  if (0 < pDVar13->nested_type_count_) {
    lVar19 = 0;
    lVar28 = 0;
    do {
      if (*(char *)(*(long *)((long)&pDVar13->nested_types_->options_ + lVar19) + 0x53) == '\0') {
        ImmutableMessageLiteGenerator
                  ((ImmutableMessageLiteGenerator *)local_1a8,
                   (Descriptor *)(&pDVar13->nested_types_->super_SymbolBase + lVar19),this->context_
                  );
        GenerateInterface((ImmutableMessageLiteGenerator *)local_1a8,printer);
        Generate((ImmutableMessageLiteGenerator *)local_1a8,printer);
        local_1a8._0_8_ = &PTR__ImmutableMessageLiteGenerator_019114e0;
        FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
        ~FieldGeneratorMap((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                            *)(local_178 + 8));
        MessageGenerator::~MessageGenerator((MessageGenerator *)local_1a8);
        pDVar13 = (this->super_MessageGenerator).descriptor_;
      }
      lVar28 = lVar28 + 1;
      lVar19 = lVar19 + 0xa0;
    } while (lVar28 < pDVar13->nested_type_count_);
  }
  if (0 < pDVar13->field_count_) {
    lVar28 = 0;
    lVar19 = 0;
    iVar18 = 0;
    do {
      pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                get(&this->field_generators_,
                    (FieldDescriptor *)(&pDVar13->fields_->super_SymbolBase + lVar28));
      iVar10 = (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[3])(pIVar11);
      iVar18 = iVar18 + iVar10;
      lVar19 = lVar19 + 1;
      pDVar13 = (this->super_MessageGenerator).descriptor_;
      lVar28 = lVar28 + 0x58;
    } while (lVar19 < pDVar13->field_count_);
    if (0 < iVar18) {
      uVar22 = 0;
      uVar16 = extraout_RDX_01;
      do {
        GetBitFieldName_abi_cxx11_((string *)local_1a8,(java *)(ulong)uVar22,(int)uVar16);
        text._M_str = "private int $bit_field_name$;\n";
        text._M_len = 0x1e;
        io::Printer::Print<char[15],std::__cxx11::string>
                  (printer,text,(char (*) [15])"bit_field_name",(string *)local_1a8);
        uVar16 = extraout_RDX_02;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          uVar16 = extraout_RDX_03;
        }
        uVar22 = uVar22 + 1;
      } while (iVar18 + 0x1fU >> 5 != uVar22);
    }
  }
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1a8,(char (*) [2])0x11df38e,(char (*) [1])(anon_var_dwarf_a22956 + 5));
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_178,(char (*) [2])0x11e92ba,(char (*) [1])(anon_var_dwarf_a22956 + 5));
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)&local_f0,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1a8,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_148,0,(hasher *)local_148,(key_equal *)&local_120,(allocator_type *)&local_b0)
  ;
  lVar19 = -0x60;
  plVar25 = local_158;
  do {
    if (plVar25 != (long *)plVar25[-2]) {
      operator_delete((long *)plVar25[-2],*plVar25 + 1);
    }
    plVar25 = plVar25 + -6;
    lVar19 = lVar19 + 0x30;
  } while (lVar19 != 0);
  this_00 = &(this->super_MessageGenerator).oneofs_;
  iVar32 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
  local_b0.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *)iVar32.node_;
  local_b0.position_ = iVar32.position_;
  iVar32 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_00);
  local_f8 = iVar32.node_;
  local_100 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *)
              CONCAT44(local_100._4_4_,iVar32.position_);
  while( true ) {
    other.position_ = local_100._0_4_;
    other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                   *)local_f8;
    other._12_4_ = 0;
    bVar8 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::Equals(&local_b0,other);
    if (bVar8) break;
    ppVar12 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::operator*(&local_b0);
    oneof = ppVar12->second;
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_1a8,&local_f0,(char (*) [11])0x12e0c8e);
    std::__cxx11::string::_M_assign((string *)(local_1a8._8_8_ + 0x10));
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[23]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_1a8,&local_f0,(char (*) [23])"oneof_capitalized_name");
    std::__cxx11::string::_M_assign((string *)(local_1a8._8_8_ + 0x10));
    aVar29.slot_ = (slot_type *)(local_1a8 + 0x10);
    pcVar20 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        ((int)((ulong)((long)oneof - (long)oneof->containing_type_->oneof_decls_) >>
                              3) * -0x49249249,(Nonnull<char_*>)aVar29.slot_);
    local_1a8._0_8_ = pcVar20 + -(long)aVar29.slot_;
    local_148._0_8_ = local_148 + 0x10;
    local_1a8._8_8_ = aVar29.slot_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,aVar29.slot_,pcVar20);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[12]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_120,&local_f0,(char (*) [12])"oneof_index");
    std::__cxx11::string::operator=
              ((string *)(local_120._M_string_length + 0x10),(string *)local_148);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
    }
    if ((this->context_->options_).opensource_runtime == true) {
      text_26._M_str =
           "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n";
      text_26._M_len = 0x4b;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_f0,text_26);
    }
    text_27._M_str = "public enum ${$$oneof_capitalized_name$Case$}$ {\n";
    text_27._M_len = 0x31;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_f0,text_27);
    begin_varname_00._M_str = "{";
    begin_varname_00._M_len = 1;
    end_varname_00._M_str = "}";
    end_varname_00._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_00,end_varname_00,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    if (0 < oneof->field_count_) {
      lVar28 = 0;
      lVar19 = 0;
      do {
        pFVar17 = oneof->fields_;
        puVar4 = *(ushort **)((long)&(pFVar17->all_names_).payload_ + lVar28);
        uVar2 = *puVar4;
        local_148._0_8_ = local_148 + 0x10;
        local_148._8_8_ = (slot_type *)0x0;
        local_148[0x10] = '\0';
        std::__cxx11::string::resize((ulong)local_148,(char)uVar2);
        absl::lts_20250127::ascii_internal::AsciiStrToUpper
                  ((Nonnull<char_*>)local_148._0_8_,
                   (Nullable<const_char_*>)((long)puVar4 + ~(ulong)uVar2),(ulong)uVar2);
        aVar29.slot_ = (slot_type *)(local_1a8 + 0x10);
        pcVar20 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                            (*(int32_t *)((long)&pFVar17->number_ + lVar28),
                             (Nonnull<char_*>)aVar29.slot_);
        local_1a8._0_8_ = pcVar20 + -(long)aVar29.slot_;
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        local_1a8._8_8_ = aVar29.slot_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,aVar29.slot_,pcVar20);
        text_00._M_str = "$field_name$($field_number$),\n";
        text_00._M_len = 0x1e;
        io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                  (printer,text_00,(char (*) [11])0x132b2b4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   (char (*) [13])0x12d509b,&local_120);
        if ((string_view *)local_120._M_dataplus._M_p != (string_view *)&local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,
                          CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                   local_120.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
        }
        begin_varname_01._M_str = "field_name";
        begin_varname_01._M_len = 10;
        end_varname_01._M_str = "field_name";
        end_varname_01._M_len = 10;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (printer,begin_varname_01,end_varname_01,
                   (FieldDescriptor *)(&pFVar17->super_SymbolBase + lVar28),
                   (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
        lVar19 = lVar19 + 1;
        lVar28 = lVar28 + 0x58;
      } while (lVar19 < oneof->field_count_);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_148,&local_f0,(char (*) [11])0x12e0c8e);
    pcVar7 = *(Nullable<const_char_*> *)(local_148._8_8_ + 0x10);
    sVar23 = *(size_t *)(local_148._8_8_ + 0x18);
    local_1a8._0_8_ = local_1a8 + 0x10;
    local_1a8._8_8_ = (slot_type *)0x0;
    local_1a8[0x10] = false;
    std::__cxx11::string::resize((ulong)local_1a8,(char)sVar23);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              ((Nonnull<char_*>)local_1a8._0_8_,pcVar7,sVar23);
    text_01._M_str = "$cap_oneof_name$_NOT_SET(0);\n";
    text_01._M_len = 0x1d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_01,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    text_28._M_str =
         "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
    ;
    text_28._M_len = 99;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_f0,text_28);
    bVar9 = (this->context_->options_).opensource_runtime;
    if ((bool)bVar9 == true) {
      text_29._M_str =
           "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\n"
      ;
      text_29._M_len = 0xb0;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_f0,text_29);
      bVar9 = (this->context_->options_).opensource_runtime;
    }
    if ((bVar9 & 1) == 0) {
      text_02._M_str = "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n";
      text_02._M_len = 0x37;
      io::Printer::Print<>(printer,text_02);
    }
    text_30._M_str =
         "public static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n";
    text_30._M_len = 0x55;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_f0,text_30);
    if (0 < oneof->field_count_) {
      lVar19 = 8;
      lVar28 = 0;
      do {
        aVar29.slot_ = (slot_type *)(local_1a8 + 0x10);
        pFVar17 = oneof->fields_;
        pcVar20 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                            (*(int32_t *)((long)pFVar17 + lVar19 + -4),(Nonnull<char_*>)aVar29.slot_
                            );
        local_1a8._0_8_ = pcVar20 + -(long)aVar29.slot_;
        local_148._0_8_ = local_148 + 0x10;
        local_1a8._8_8_ = aVar29.slot_;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_148,aVar29.slot_,pcVar20);
        puVar4 = *(ushort **)(&pFVar17->super_SymbolBase + lVar19);
        uVar2 = *puVar4;
        local_120._M_string_length = 0;
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        local_120.field_2._M_local_buf[0] = false;
        std::__cxx11::string::resize((ulong)&local_120,(char)uVar2);
        absl::lts_20250127::ascii_internal::AsciiStrToUpper
                  (local_120._M_dataplus._M_p,(Nullable<const_char_*>)((long)puVar4 + ~(ulong)uVar2)
                   ,(ulong)uVar2);
        text_03._M_str = "    case $field_number$: return $field_name$;\n";
        text_03._M_len = 0x2e;
        io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                  (printer,text_03,(char (*) [13])0x12d509b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   (char (*) [11])0x132b2b4,&local_120);
        if ((string_view *)local_120._M_dataplus._M_p != (string_view *)&local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,
                          CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                   local_120.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
        }
        lVar28 = lVar28 + 1;
        lVar19 = lVar19 + 0x58;
      } while (lVar28 < oneof->field_count_);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_148,&local_f0,(char (*) [11])0x12e0c8e);
    pcVar7 = *(Nullable<const_char_*> *)(local_148._8_8_ + 0x10);
    sVar23 = *(size_t *)(local_148._8_8_ + 0x18);
    local_1a8._0_8_ = local_1a8 + 0x10;
    local_1a8._8_8_ = (slot_type *)0x0;
    local_1a8[0x10] = false;
    std::__cxx11::string::resize((ulong)local_1a8,(char)sVar23);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              ((Nonnull<char_*>)local_1a8._0_8_,pcVar7,sVar23);
    text_04._M_str =
         "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
    ;
    text_04._M_len = 0x7d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_04,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    io::Printer::Outdent(printer);
    text_05._M_str = "};\n\n";
    text_05._M_len = 4;
    io::Printer::Print<>(printer,text_05);
    text_31._M_str =
         "@java.lang.Override\npublic $oneof_capitalized_name$Case\n${$get$oneof_capitalized_name$Case$}$() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n"
    ;
    text_31._M_len = 0xaf;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_f0,text_31);
    begin_varname_02._M_str = "{";
    begin_varname_02._M_len = 1;
    end_varname_02._M_str = "}";
    end_varname_02._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_02,end_varname_02,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    text_32._M_str =
         "\nprivate void ${$clear$oneof_capitalized_name$$}$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
    ;
    text_32._M_len = 0x6a;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_f0,text_32);
    begin_varname_03._M_str = "{";
    begin_varname_03._M_len = 1;
    end_varname_03._M_str = "}";
    end_varname_03._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_03,end_varname_03,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::increment(&local_b0);
  }
  pDVar13 = (this->super_MessageGenerator).descriptor_;
  uVar15 = (ulong)(uint)pDVar13->field_count_;
  if (0 < pDVar13->field_count_) {
    pFVar17 = (FieldDescriptor *)&this->field_generators_;
    pbVar21 = (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
               *)0x0;
    lVar19 = 0;
    local_100 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *)
                pFVar17;
    do {
      if ((int)uVar15 <= lVar19) {
        pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar19,(long)(int)uVar15,"index < field_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar14);
LAB_00e7295c:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_1a8);
      }
      FieldConstantName_abi_cxx11_
                ((string *)local_148,(java *)(&pDVar13->fields_->super_SymbolBase + (long)pbVar21),
                 pFVar17);
      pDVar13 = (this->super_MessageGenerator).descriptor_;
      lVar28 = (long)pDVar13->field_count_;
      if (lVar28 <= lVar19) {
        pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar19,lVar28,"index < field_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar14);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
      aVar29.slot_ = (slot_type *)(local_1a8 + 0x10);
      local_f8 = pbVar21;
      pcVar20 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (*(int32_t *)((long)&pDVar13->fields_->number_ + (long)pbVar21),
                           (Nonnull<char_*>)aVar29.slot_);
      local_1a8._0_8_ = pcVar20 + -(long)aVar29.slot_;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_1a8._8_8_ = aVar29.slot_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,aVar29.slot_,pcVar20);
      text_06._M_str = "public static final int $constant_name$ = $number$;\n";
      text_06._M_len = 0x34;
      io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,text_06,(char (*) [14])0x1322c36,(string *)local_148,
                 (char (*) [7])0x115bead,&local_120);
      if ((string_view *)local_120._M_dataplus._M_p != (string_view *)&local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
      }
      pbVar21 = local_f8;
      pDVar13 = (this->super_MessageGenerator).descriptor_;
      lVar28 = (long)pDVar13->field_count_;
      if (lVar28 <= lVar19) {
        pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar19,lVar28,"index < field_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar14);
        goto LAB_00e7295c;
      }
      begin_varname_04._M_str = "constant_name";
      begin_varname_04._M_len = 0xd;
      end_varname_04._M_str = "constant_name";
      end_varname_04._M_len = 0xd;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,begin_varname_04,end_varname_04,
                 (FieldDescriptor *)(&pDVar13->fields_->super_SymbolBase + (long)local_f8),
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      pDVar13 = (this->super_MessageGenerator).descriptor_;
      lVar28 = (long)pDVar13->field_count_;
      if (lVar28 <= lVar19) {
        pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar19,lVar28,"index < field_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar14);
        goto LAB_00e7295c;
      }
      pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                get(local_100,
                    (FieldDescriptor *)(&pDVar13->fields_->super_SymbolBase + (long)pbVar21));
      (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[5])(pIVar11,printer);
      text_07._M_str = "\n";
      text_07._M_len = 1;
      io::Printer::Print<>(printer,text_07);
      lVar19 = lVar19 + 1;
      pDVar13 = (this->super_MessageGenerator).descriptor_;
      uVar15 = (ulong)pDVar13->field_count_;
      pbVar21 = pbVar21 + 0x58;
      pFVar17 = extraout_RDX_04;
    } while (lVar19 < (long)uVar15);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  bVar8 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar8) {
    text_08._M_str = "private byte memoizedIsInitialized = 2;\n";
    text_08._M_len = 0x28;
    io::Printer::Print<>(printer,text_08);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_1a8,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_09._M_str =
       "@java.lang.Override\n@java.lang.SuppressWarnings({\"ThrowNull\"})\nprotected final java.lang.Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    java.lang.Object arg0, java.lang.Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
  ;
  text_09._M_len = 0x142;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_09,(char (*) [10])0x13005f3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  text_10._M_str = "case NEW_BUILDER: {\n";
  text_10._M_len = 0x14;
  io::Printer::Print<>(printer,text_10);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_11._M_str = "return new Builder();\n";
  text_11._M_len = 0x16;
  io::Printer::Print<>(printer,text_11);
  io::Printer::Outdent(printer);
  text_12._M_str = "}\ncase BUILD_MESSAGE_INFO: {\n";
  text_12._M_len = 0x1d;
  io::Printer::Print<>(printer,text_12);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  GenerateDynamicMethodNewBuildMessageInfo(this,printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_1a8,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_13._M_str =
       "}\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  com.google.protobuf.Parser<$classname$> parser = PARSER;\n  if (parser == null) {\n    synchronized ($classname$.class) {\n      parser = PARSER;\n      if (parser == null) {\n        parser =\n            new DefaultInstanceBasedParser<$classname$>(\n                DEFAULT_INSTANCE);\n        PARSER = parser;\n      }\n    }\n  }\n  return parser;\n"
  ;
  text_13._M_len = 0x1a5;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_13,(char (*) [10])0x13005f3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  bVar8 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  sVar23 = 0xe7;
  if (bVar8) {
    sVar23 = 0xb6;
  }
  pcVar27 = 
  "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return (byte) 1;\n}\n// SET_MEMOIZED_IS_INITIALIZED is never called for this message.\n// So it can do anything. Combine with default case for smaller codegen.\ncase SET_MEMOIZED_IS_INITIALIZED:\n"
  ;
  if (bVar8) {
    pcVar27 = 
    "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return memoizedIsInitialized;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n  return null;\n}\n"
    ;
  }
  text_14._M_str = pcVar27;
  text_14._M_len = sVar23;
  io::Printer::Print<>(printer,text_14);
  io::Printer::Outdent(printer);
  text_15._M_str =
       "}\n// Should never happen. Generates tight code to throw an exception.\nthrow null;\n";
  text_15._M_len = 0x52;
  io::Printer::Print<>(printer,text_15);
  io::Printer::Outdent(printer);
  text_16._M_str = "}\n\n";
  text_16._M_len = 3;
  io::Printer::Print<>(printer,text_16);
  pcVar27 = (((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_1a8._0_8_ = ZEXT28(*(ushort *)(pcVar27 + 2));
  local_1a8._8_8_ = pcVar27 + ~local_1a8._0_8_;
  text_17._M_str = "\n// @@protoc_insertion_point(class_scope:$full_name$)\n";
  text_17._M_len = 0x36;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_17,(char (*) [10])0x13a00f9,
             (basic_string_view<char,_std::char_traits<char>_> *)local_1a8);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_1a8,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_18._M_str = "private static final $classname$ DEFAULT_INSTANCE;\n";
  text_18._M_len = 0x33;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_18,(char (*) [10])0x13005f3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  puVar4 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_1a8._0_8_ = ZEXT28(*puVar4);
  local_1a8._8_8_ = (long)puVar4 + ~local_1a8._0_8_;
  text_19._M_str =
       "static {\n  $classname$ defaultInstance = new $classname$();\n  // New instances are implicitly immutable so no need to make\n  // immutable.\n  DEFAULT_INSTANCE = defaultInstance;\n  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n    $classname$.class, defaultInstance);\n}\n\n"
  ;
  text_19._M_len = 0x121;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_19,(char (*) [10])0x13005f3,
             (basic_string_view<char,_std::char_traits<char>_> *)local_1a8);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_1a8,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_20._M_str =
       "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n";
  text_20._M_len = 0x4f;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_20,(char (*) [10])0x13005f3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  pDVar13 = (this->super_MessageGenerator).descriptor_;
  psVar24 = pDVar13->file_->name_;
  if (psVar24->_M_string_length == 0x1e) {
    pcVar6 = (psVar24->_M_dataplus)._M_p;
    auVar31[0] = -(pcVar6[0xe] == 'f');
    auVar31[1] = -(pcVar6[0xf] == '/');
    auVar31[2] = -(pcVar6[0x10] == 'w');
    auVar31[3] = -(pcVar6[0x11] == 'r');
    auVar31[4] = -(pcVar6[0x12] == 'a');
    auVar31[5] = -(pcVar6[0x13] == 'p');
    auVar31[6] = -(pcVar6[0x14] == 'p');
    auVar31[7] = -(pcVar6[0x15] == 'e');
    auVar31[8] = -(pcVar6[0x16] == 'r');
    auVar31[9] = -(pcVar6[0x17] == 's');
    auVar31[10] = -(pcVar6[0x18] == '.');
    auVar31[0xb] = -(pcVar6[0x19] == 'p');
    auVar31[0xc] = -(pcVar6[0x1a] == 'r');
    auVar31[0xd] = -(pcVar6[0x1b] == 'o');
    auVar31[0xe] = -(pcVar6[0x1c] == 't');
    auVar31[0xf] = -(pcVar6[0x1d] == 'o');
    auVar30[0] = -(*pcVar6 == 'g');
    auVar30[1] = -(pcVar6[1] == 'o');
    auVar30[2] = -(pcVar6[2] == 'o');
    auVar30[3] = -(pcVar6[3] == 'g');
    auVar30[4] = -(pcVar6[4] == 'l');
    auVar30[5] = -(pcVar6[5] == 'e');
    auVar30[6] = -(pcVar6[6] == '/');
    auVar30[7] = -(pcVar6[7] == 'p');
    auVar30[8] = -(pcVar6[8] == 'r');
    auVar30[9] = -(pcVar6[9] == 'o');
    auVar30[10] = -(pcVar6[10] == 't');
    auVar30[0xb] = -(pcVar6[0xb] == 'o');
    auVar30[0xc] = -(pcVar6[0xc] == 'b');
    auVar30[0xd] = -(pcVar6[0xd] == 'u');
    auVar30[0xe] = -(pcVar6[0xe] == 'f');
    auVar30[0xf] = -(pcVar6[0xf] == '/');
    auVar30 = auVar30 & auVar31;
    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) {
      ClassNameResolver::GetClassName_abi_cxx11_
                ((string *)local_1a8,this->name_resolver_,pDVar13,true);
      pDVar13 = (this->super_MessageGenerator).descriptor_;
      lVar19 = (long)pDVar13->field_count_;
      if (lVar19 < 1) {
        pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (0,lVar19,"index < field_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_148,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar14);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_148);
      }
      type = GetJavaType(pDVar13->fields_);
      local_120._0_16_ = PrimitiveTypeName(type);
      text_21._M_str =
           "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
      ;
      text_21._M_len = 0x65;
      io::Printer::
      Print<char[10],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
                (printer,text_21,(char (*) [10])0x13005f3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [11])0x1357b2d,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_120);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      pDVar13 = (this->super_MessageGenerator).descriptor_;
    }
  }
  puVar4 = (ushort *)(pDVar13->all_names_).payload_;
  local_1a8._0_8_ = ZEXT28(*puVar4);
  local_1a8._8_8_ = (long)puVar4 + ~local_1a8._0_8_;
  text_22._M_str =
       "private static volatile com.google.protobuf.Parser<$classname$> PARSER;\n\npublic static com.google.protobuf.Parser<$classname$> parser() {\n  return DEFAULT_INSTANCE.getParserForType();\n}\n"
  ;
  text_22._M_len = 0xba;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_22,(char (*) [10])0x13005f3,
             (basic_string_view<char,_std::char_traits<char>_> *)local_1a8);
  pDVar13 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar13->extension_count_) {
    lVar19 = 0;
    lVar28 = 0;
    do {
      ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)local_1a8,
                 (FieldDescriptor *)(&pDVar13->extensions_->super_SymbolBase + lVar19),
                 this->context_);
      ImmutableExtensionLiteGenerator::Generate
                ((ImmutableExtensionLiteGenerator *)local_1a8,printer);
      ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)local_1a8);
      lVar28 = lVar28 + 1;
      pDVar13 = (this->super_MessageGenerator).descriptor_;
      lVar19 = lVar19 + 0x58;
    } while (lVar28 < pDVar13->extension_count_);
  }
  io::Printer::Outdent(printer);
  text_23._M_str = "}\n\n";
  text_23._M_len = 3;
  io::Printer::Print<>(printer,text_23);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_f0);
  if ((bool *)local_d0.first.ctrl_ != &local_d0.second) {
    operator_delete(local_d0.first.ctrl_,CONCAT71(local_d0._17_7_,local_d0.second) + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_a0);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  absl::flat_hash_map<absl::string_view, std::string> variables = {{"{", ""},
                                                                   {"}", ""}};
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = std::string(descriptor_->name());
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class ${$$classname$$}$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = absl::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class ${$$classname$$}$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Annotate("{", "}", descriptor_);
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(descriptor_->nested_type(i),
                                                   context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  absl::flat_hash_map<absl::string_view, std::string> vars = {{"{", ""},
                                                              {"}", ""}};
  for (auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = absl::StrCat((oneof)->index());
    if (context_->options().opensource_runtime) {
      // oneofCase_ and oneof_
      printer->Print(vars,
                     "private int $oneof_name$Case_ = 0;\n"
                     "private java.lang.Object $oneof_name$_;\n");
    }
    // OneofCase enum
    printer->Print(vars, "public enum ${$$oneof_capitalized_name$Case$}$ {\n");
    printer->Annotate("{", "}", oneof);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("$field_name$($field_number$),\n", "field_name",
                     absl::AsciiStrToUpper(field->name()), "field_number",
                     absl::StrCat(field->number()));
      printer->Annotate("field_name", field);
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    if (context_->options().opensource_runtime) {
      printer->Print(
          vars,
          "/**\n"
          " * @deprecated Use {@link #forNumber(int)} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
          "  return forNumber(value);\n"
          "}\n"
          "\n");
    }
    if (!context_->options().opensource_runtime) {
      printer->Print(
          "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
    }
    printer->Print(
        vars,
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", absl::StrCat(field->number()),
                     "field_name", absl::AsciiStrToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        // TODO: Rename this to "getFieldNumber" or something to
        // disambiguate it from actual proto enums.
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "${$get$oneof_capitalized_name$Case$}$() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n");
    printer->Annotate("{", "}", oneof);
    printer->Print(vars,
                   "\n"
                   "private void ${$clear$oneof_capitalized_name$$}$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n"
                   "}\n"
                   "\n");
    printer->Annotate("{", "}", oneof);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", absl::StrCat(descriptor_->field(i)->number()));
    printer->Annotate("constant_name", descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). 0 means false, 1 means true, and all other values
    // mean not yet computed.
    printer->Print("private byte memoizedIsInitialized = 2;\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "@java.lang.SuppressWarnings({\"ThrowNull\"})\n"
      "protected final java.lang.Object dynamicMethod(\n"
      "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
      "    java.lang.Object arg0, java.lang.Object arg1) {\n"
      "  switch (method) {\n"
      "    case NEW_MUTABLE_INSTANCE: {\n"
      "      return new $classname$();\n"
      "    }\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print("case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case BUILD_MESSAGE_INFO: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuildMessageInfo(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case GET_DEFAULT_INSTANCE: {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "case GET_PARSER: {\n"
      // Generally one would use the lazy initialization holder pattern for
      // manipulating static fields but that has exceptional cost on Android as
      // it will generate an extra class for every message. Instead, use the
      // double-check locking pattern which works just as well.
      //
      // The "parser" temporary mirrors the "PARSER" field to eliminate a read
      // at the final return statement.
      "  com.google.protobuf.Parser<$classname$> parser = PARSER;\n"
      "  if (parser == null) {\n"
      "    synchronized ($classname$.class) {\n"
      "      parser = PARSER;\n"
      "      if (parser == null) {\n"
      "        parser =\n"
      "            new DefaultInstanceBasedParser<$classname$>(\n"
      "                DEFAULT_INSTANCE);\n"
      "        PARSER = parser;\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return parser;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  if (HasRequiredFields(descriptor_)) {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return memoizedIsInitialized;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n"
        "  return null;\n"
        "}\n");
  } else {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return (byte) 1;\n"
        "}\n"
        "// SET_MEMOIZED_IS_INITIALIZED is never called for this message.\n"
        "// So it can do anything. Combine with default case for smaller "
        "codegen.\n"
        "case SET_MEMOIZED_IS_INITIALIZED:\n");
  }

  printer->Outdent();
  printer->Print(
      "}\n"
      "// Should never happen. Generates tight code to throw an exception.\n"
      "throw null;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "static {\n"
      "  $classname$ defaultInstance = new $classname$();\n"
      "  // New instances are implicitly immutable so no need to make\n"
      "  // immutable.\n"
      "  DEFAULT_INSTANCE = defaultInstance;\n"
      // Register the default instance in a map. This map will be used by
      // experimental runtime to lookup default instance given a class instance
      // without using Java reflection.
      "  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n"
      "    $classname$.class, defaultInstance);\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}